

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DeserializePrimitives(CJSON *json)

{
  ostream *poVar1;
  PrimitiveTestClass ptc;
  allocator<char> local_229;
  string local_228;
  PrimitiveTestClass local_208;
  PrimitiveTestClass local_108;
  
  local_208.SIZE = 10;
  memset(&local_208.str,0,0x98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,
             "{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}"
             ,&local_229);
  CJSON::Deserialize<PrimitiveTestClass,_nullptr>(&local_108,json,&local_228);
  PrimitiveTestClass::operator=(&local_208,&local_108);
  PrimitiveTestClass::~PrimitiveTestClass(&local_108);
  std::__cxx11::string::~string((string *)&local_228);
  poVar1 = std::operator<<((ostream *)&std::cout,"PrimitiveTestClass: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  PrimitiveTestClass::Print(&local_208);
  PrimitiveTestClass::~PrimitiveTestClass(&local_208);
  return;
}

Assistant:

void DeserializePrimitives(CJSON &json)
{
    PrimitiveTestClass ptc;
    ptc = json.Deserialize<PrimitiveTestClass>("{\"c\":-1,\"d\":432.324324,\"f\":1.342323,\"i\":1048575,\"l\":1048575,\"ld\":423432.346544,\"ll\":1048575,\"pc\":[-1,-1,-1,-1,-1,-1,-1,-1,-1,-1],\"pd\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pf\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pi\":[255,255,255,255,255,255,255,255,255,255],\"pl\":[255,255,255,255,255,255,255,255,255,255],\"pld\":[255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000,255.000000],\"pll\":[255,255,255,255,255,255,255,255,255,255],\"ps\":[255,255,255,255,255,255,255,255,255,255],\"pto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}],\"puc\":[255,255,255,255,255,255,255,255,255,255],\"pui\":[255,255,255,255,255,255,255,255,255,255],\"pul\":[255,255,255,255,255,255,255,255,255,255],\"pull\":[255,255,255,255,255,255,255,255,255,255],\"pus\":[255,255,255,255,255,255,255,255,255,255],\"s\":-1,\"str\":\"Hello World!\",\"uc\":255,\"ui\":1048575,\"ul\":1048575,\"ull\":1048575,\"us\":65535, \"spi\":[10,10,10,10,10,10,10,10,10,10], \"spto\":[{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"},{\"str\":\"Hello World!\"}]}");
    cout << "PrimitiveTestClass: " << endl;
    ptc.Print();
}